

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

bool check_barred(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  bool bVar1;
  int iVar2;
  CClass *pCVar3;
  OBJ_DATA *pOVar4;
  long in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  OBJ_DATA *tattoo;
  CHAR_DATA *blocker;
  int field;
  ROOM_INDEX_DATA *in_stack_000023e8;
  CHAR_DATA *in_stack_000023f0;
  CHAR_DATA *in_stack_000023f8;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  
  iVar6 = 0;
  ch_00 = in_RDI->in_room->people;
  do {
    if (ch_00 == (CHAR_DATA *)0x0) {
      return false;
    }
    bVar1 = is_npc(in_stack_ffffffffffffffc8);
    if (((bVar1) && (ch_00->pIndexData->barred_entry != (BARRED_DATA *)0x0)) &&
       (ch_00->pIndexData->barred_entry->vnum == *(short *)(in_RSI + 0x13a))) {
      if (ch_00->pIndexData->barred_entry->type == 0) {
        pCVar3 = char_data::Class((char_data *)CONCAT44(iVar6,in_stack_ffffffffffffffe0));
        iVar6 = CClass::GetIndex(pCVar3);
      }
      if (ch_00->pIndexData->barred_entry->type == 1) {
        iVar6 = (int)in_RDI->cabal;
      }
      if (ch_00->pIndexData->barred_entry->type == 2) {
        iVar6 = (int)in_RDI->size;
      }
      if (ch_00->pIndexData->barred_entry->type == 4) {
        iVar6 = (int)in_RDI->level;
      }
      if (ch_00->pIndexData->barred_entry->type == 3) {
        pOVar4 = get_eq_char(in_RDI,0x13);
        if ((pOVar4 == (OBJ_DATA *)0x0) && (ch_00->pIndexData->barred_entry->value != 0)) {
          bVar1 = bar_entry(in_stack_000023f8,in_stack_000023f0,in_stack_000023e8);
          return bVar1;
        }
        iVar6 = (int)pOVar4->pIndexData->vnum;
      }
      if (ch_00->pIndexData->barred_entry->type == 0) {
        pCVar3 = char_data::Class((char_data *)CONCAT44(iVar6,in_stack_ffffffffffffffe0));
        iVar2 = CClass::GetIndex(pCVar3);
        if (iVar2 == ch_00->pIndexData->barred_entry->value) {
          in_stack_ffffffffffffffc8 = (CHAR_DATA *)ch_00->act[0];
          _Var5 = std::pow<int,int>(0,0x563311);
          if (((((ulong)in_stack_ffffffffffffffc8 & (long)_Var5) != 0) && (0 < in_RDI->pause)) &&
             ((in_RDI->ghost < 1 && (bVar1 = is_immortal(in_stack_ffffffffffffffc8), !bVar1)))) {
            send_to_char((char *)CONCAT44(iVar6,in_stack_ffffffffffffffe0),ch_00);
            return true;
          }
        }
      }
      if (((ch_00->pIndexData->barred_entry->comparison == 0) &&
          (iVar6 != ch_00->pIndexData->barred_entry->value)) ||
         (((ch_00->pIndexData->barred_entry->comparison == 1 &&
           (ch_00->pIndexData->barred_entry->value <= iVar6)) ||
          ((ch_00->pIndexData->barred_entry->comparison == 2 &&
           (iVar6 <= ch_00->pIndexData->barred_entry->value)))))) {
        bVar1 = bar_entry(in_stack_000023f8,in_stack_000023f0,in_stack_000023e8);
        return bVar1;
      }
    }
    ch_00 = ch_00->next_in_room;
  } while( true );
}

Assistant:

bool check_barred(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	int field = 0;

	for (auto blocker = ch->in_room->people; blocker != nullptr; blocker = blocker->next_in_room)
	{
		if (is_npc(blocker)
			&& blocker->pIndexData->barred_entry
			&& blocker->pIndexData->barred_entry->vnum == to_room->vnum)
		{

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS)
				field = ch->Class()->GetIndex();

			if (blocker->pIndexData->barred_entry->type == BAR_CABAL)
				field = ch->cabal;

			if (blocker->pIndexData->barred_entry->type == BAR_SIZE)
				field = ch->size;

			if (blocker->pIndexData->barred_entry->type == BAR_LEVEL)
				field = ch->level;

			if (blocker->pIndexData->barred_entry->type == BAR_TATTOO)
			{
				auto tattoo = get_eq_char(ch, WEAR_BRAND);

				if (!tattoo && blocker->pIndexData->barred_entry->value)
					return bar_entry(ch, blocker, to_room);

				field = tattoo->pIndexData->vnum;
			}

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS
				&& ch->Class()->GetIndex() == blocker->pIndexData->barred_entry->value
				&& IS_SET(blocker->act, ACT_GUILDGUARD)
				&& ch->pause > 0
				&& ch->ghost <= 0
				&& !is_immortal(ch))
			{
				send_to_char("Your guild will not offer you sanctuary yet.\n\r", ch);
				return true;
			}

			if ((blocker->pIndexData->barred_entry->comparison == BAR_EQUAL_TO && field != blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_LESS_THAN && field >= blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_GREATER_THAN && field <= blocker->pIndexData->barred_entry->value))
			{
				return bar_entry(ch, blocker, to_room);
			}
		}
	}

	return false;
}